

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O2

void estimate_noise(FIRSTPASS_STATS *first_stats,FIRSTPASS_STATS *last_stats,
                   aom_internal_error_info *error_info)

{
  FIRSTPASS_STATS *pFVar1;
  FIRSTPASS_STATS *pFVar2;
  double *pdVar3;
  ulong uVar4;
  void *memblk;
  long lVar5;
  FIRSTPASS_STATS *pFVar6;
  long lVar7;
  double *pdVar8;
  ulong uVar9;
  int j;
  int iVar10;
  int iVar11;
  int iVar12;
  double total_noise;
  double dVar13;
  double total_wt;
  double dVar14;
  double dVar15;
  
  for (pFVar2 = first_stats + 2; pFVar2 < last_stats; pFVar2 = pFVar2 + 1) {
    pFVar2->noise_var = 0.0;
    if (((pFVar2->is_flash == 0) && (pFVar2[-1].is_flash == 0)) && (pFVar2[-2].is_flash == 0)) {
      dVar13 = (pFVar2->intra_error - pFVar2->coded_error) * pFVar2[-1].intra_error;
      if (0.0 < dVar13) {
        dVar15 = (pFVar2[-1].intra_error - pFVar2[-1].coded_error) * pFVar2[-2].intra_error;
        if ((0.0 < dVar15) &&
           (dVar14 = pFVar2[-2].intra_error * (pFVar2->intra_error - pFVar2->sr_coded_error),
           0.0 < dVar14)) {
          if (dVar13 < 0.0) {
            dVar13 = sqrt(dVar13);
          }
          else {
            dVar13 = SQRT(dVar13);
          }
          if (dVar15 < 0.0) {
            dVar15 = sqrt(dVar15);
          }
          else {
            dVar15 = SQRT(dVar15);
          }
          if (dVar14 < 0.0) {
            dVar14 = sqrt(dVar14);
          }
          else {
            dVar14 = SQRT(dVar14);
          }
          dVar13 = pFVar2[-1].intra_error - (dVar13 * dVar15) / dVar14;
          if (dVar13 <= 0.01) {
            dVar13 = 0.01;
          }
          pFVar2->noise_var = dVar13;
        }
      }
    }
  }
  pFVar2 = first_stats + 3;
  lVar5 = 0x1d0;
LAB_001e3b5b:
  pFVar1 = (FIRSTPASS_STATS *)((long)&first_stats->frame + lVar5);
  if (last_stats <= pFVar1) {
    pdVar3 = &first_stats[3].noise_var;
    lVar5 = 0x1d0;
    while( true ) {
      pFVar2 = (FIRSTPASS_STATS *)((long)&first_stats->frame + lVar5);
      if (last_stats <= pFVar2) {
        if (first_stats + 2 < last_stats) {
          for (uVar4 = 0; uVar4 < 0x1d0; uVar4 = uVar4 + 0xe8) {
            *(double *)((long)&first_stats->noise_var + uVar4) = first_stats[2].noise_var;
          }
        }
        uVar4 = ((long)last_stats - (long)first_stats) / 0xe8;
        iVar12 = (int)uVar4;
        memblk = aom_malloc((long)iVar12 << 3);
        if (memblk == (void *)0x0) {
          aom_internal_error(error_info,AOM_CODEC_MEM_ERROR,
                             "Error allocating buffers in smooth_filter_noise()");
          return;
        }
        uVar4 = uVar4 & 0xffffffff;
        if (iVar12 < 1) {
          uVar4 = 0;
        }
        for (uVar9 = 0; uVar9 != uVar4; uVar9 = uVar9 + 1) {
          dVar13 = 0.0;
          dVar15 = 0.0;
          for (iVar10 = -3; iVar10 != 4; iVar10 = iVar10 + 1) {
            iVar11 = (int)uVar9 + iVar10;
            if (iVar11 < 1) {
              iVar11 = 0;
            }
            if (iVar12 + -1 <= iVar11) {
              iVar11 = iVar12 + -1;
            }
            if (first_stats[iVar11].is_flash == 0) {
              dVar13 = dVar13 + first_stats[iVar11].noise_var;
              dVar15 = dVar15 + 1.0;
            }
          }
          if (dVar15 <= 0.01) {
            dVar13 = first_stats[uVar9].noise_var;
          }
          else {
            dVar13 = dVar13 / dVar15;
          }
          *(double *)((long)memblk + uVar9 * 8) = dVar13;
        }
        pdVar3 = &first_stats->noise_var;
        for (uVar9 = 0; uVar4 != uVar9; uVar9 = uVar9 + 1) {
          *pdVar3 = *(double *)((long)memblk + uVar9 * 8);
          pdVar3 = pdVar3 + 0x1d;
        }
        aom_free(memblk);
        return;
      }
      pdVar8 = pdVar3;
      if (((pFVar2->is_flash != 0) || (pFVar2[-1].is_flash != 0)) || (pFVar2[-2].is_flash != 0))
      break;
LAB_001e3cdb:
      lVar5 = lVar5 + 0xe8;
      pdVar3 = pdVar3 + 0x1d;
    }
    for (; lVar7 = lVar5, (FIRSTPASS_STATS *)(pdVar8 + -0x19) < last_stats; pdVar8 = pdVar8 + 0x1d)
    {
      if (((pdVar8[-1] == 0.0) && (pdVar8[-0x1e] == 0.0)) && (pdVar8[-0x3b] == 0.0))
      goto LAB_001e3ccf;
    }
LAB_001e3c98:
    if (0x2b7 < lVar7) {
      if (((*(long *)((long)first_stats + lVar7 + -0x28) != 0) ||
          (*(long *)((long)first_stats + lVar7 + -0x110) != 0)) ||
         (*(long *)((long)first_stats + lVar7 + -0x1f8) != 0)) goto LAB_001e3cbf;
      pdVar8 = (double *)((long)first_stats + lVar7 + -0x20);
LAB_001e3ccf:
      pFVar2->noise_var = *pdVar8;
    }
    goto LAB_001e3cdb;
  }
  if (((pFVar1->is_flash == 0) && (pFVar1[-1].is_flash == 0)) &&
     ((pFVar1[-2].is_flash == 0 &&
      (pFVar6 = pFVar2, pFVar1->noise_var <= 1.0 && pFVar1->noise_var != 1.0)))) {
    for (; lVar7 = lVar5, pFVar6 < last_stats; pFVar6 = pFVar6 + 1) {
      if ((((pFVar6->is_flash == 0) && (pFVar6[-1].is_flash == 0)) && (pFVar6[-2].is_flash == 0)) &&
         (dVar13 = pFVar6->noise_var, 1.0 <= dVar13)) goto LAB_001e3c16;
    }
    for (; 0x2b7 < lVar7; lVar7 = lVar7 + -0xe8) {
      if (((*(long *)((long)first_stats + lVar7 + -0x28) == 0) &&
          (*(long *)((long)first_stats + lVar7 + -0x110) == 0)) &&
         ((*(long *)((long)first_stats + lVar7 + -0x1f8) == 0 &&
          (dVar13 = *(double *)((long)first_stats + lVar7 + -0x20), 1.0 <= dVar13))))
      goto LAB_001e3c16;
    }
  }
  goto LAB_001e3c1e;
LAB_001e3cbf:
  lVar7 = lVar7 + -0xe8;
  goto LAB_001e3c98;
LAB_001e3c16:
  pFVar1->noise_var = dVar13;
LAB_001e3c1e:
  lVar5 = lVar5 + 0xe8;
  pFVar2 = pFVar2 + 1;
  goto LAB_001e3b5b;
}

Assistant:

static void estimate_noise(FIRSTPASS_STATS *first_stats,
                           FIRSTPASS_STATS *last_stats,
                           struct aom_internal_error_info *error_info) {
  FIRSTPASS_STATS *this_stats, *next_stats;
  double C1, C2, C3, noise;
  for (this_stats = first_stats + 2; this_stats < last_stats; this_stats++) {
    this_stats->noise_var = 0.0;
    // flashes tend to have high correlation of innovations, so ignore them.
    if (this_stats->is_flash || (this_stats - 1)->is_flash ||
        (this_stats - 2)->is_flash)
      continue;

    C1 = (this_stats - 1)->intra_error *
         (this_stats->intra_error - this_stats->coded_error);
    C2 = (this_stats - 2)->intra_error *
         ((this_stats - 1)->intra_error - (this_stats - 1)->coded_error);
    C3 = (this_stats - 2)->intra_error *
         (this_stats->intra_error - this_stats->sr_coded_error);
    if (C1 <= 0 || C2 <= 0 || C3 <= 0) continue;
    C1 = sqrt(C1);
    C2 = sqrt(C2);
    C3 = sqrt(C3);

    noise = (this_stats - 1)->intra_error - C1 * C2 / C3;
    noise = AOMMAX(noise, 0.01);
    this_stats->noise_var = noise;
  }

  // Copy noise from the neighbor if the noise value is not trustworthy
  for (this_stats = first_stats + 2; this_stats < last_stats; this_stats++) {
    if (this_stats->is_flash || (this_stats - 1)->is_flash ||
        (this_stats - 2)->is_flash)
      continue;
    if (this_stats->noise_var < 1.0) {
      int found = 0;
      // TODO(bohanli): consider expanding to two directions at the same time
      for (next_stats = this_stats + 1; next_stats < last_stats; next_stats++) {
        if (next_stats->is_flash || (next_stats - 1)->is_flash ||
            (next_stats - 2)->is_flash || next_stats->noise_var < 1.0)
          continue;
        found = 1;
        this_stats->noise_var = next_stats->noise_var;
        break;
      }
      if (found) continue;
      for (next_stats = this_stats - 1; next_stats >= first_stats + 2;
           next_stats--) {
        if (next_stats->is_flash || (next_stats - 1)->is_flash ||
            (next_stats - 2)->is_flash || next_stats->noise_var < 1.0)
          continue;
        this_stats->noise_var = next_stats->noise_var;
        break;
      }
    }
  }

  // copy the noise if this is a flash
  for (this_stats = first_stats + 2; this_stats < last_stats; this_stats++) {
    if (this_stats->is_flash || (this_stats - 1)->is_flash ||
        (this_stats - 2)->is_flash) {
      int found = 0;
      for (next_stats = this_stats + 1; next_stats < last_stats; next_stats++) {
        if (next_stats->is_flash || (next_stats - 1)->is_flash ||
            (next_stats - 2)->is_flash)
          continue;
        found = 1;
        this_stats->noise_var = next_stats->noise_var;
        break;
      }
      if (found) continue;
      for (next_stats = this_stats - 1; next_stats >= first_stats + 2;
           next_stats--) {
        if (next_stats->is_flash || (next_stats - 1)->is_flash ||
            (next_stats - 2)->is_flash)
          continue;
        this_stats->noise_var = next_stats->noise_var;
        break;
      }
    }
  }

  // if we are at the first 2 frames, copy the noise
  for (this_stats = first_stats;
       this_stats < first_stats + 2 && (first_stats + 2) < last_stats;
       this_stats++) {
    this_stats->noise_var = (first_stats + 2)->noise_var;
  }

  if (smooth_filter_noise(first_stats, last_stats) == -1) {
    aom_internal_error(error_info, AOM_CODEC_MEM_ERROR,
                       "Error allocating buffers in smooth_filter_noise()");
  }
}